

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

SelectionSet * OpenMD::operator|(SelectionSet *ss1,SelectionSet *ss2)

{
  const_reference bs;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDX;
  OpenMDBitSet *in_RDI;
  int i;
  SelectionSet *result;
  SelectionSet *in_stack_ffffffffffffffb8;
  OpenMDBitSet *this;
  undefined4 local_20;
  
  this = in_RDI;
  SelectionSet::SelectionSet((SelectionSet *)in_RDI,in_stack_ffffffffffffffb8);
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    bs = std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                   (in_RDX,(long)local_20);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)this,
               (long)local_20);
    OpenMDBitSet::operator|=(this,bs);
  }
  return (SelectionSet *)in_RDI;
}

Assistant:

SelectionSet operator|(const SelectionSet& ss1, const SelectionSet& ss2) {
    SelectionSet result(ss1);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] |= ss2.bitsets_[i];
    return result;
  }